

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

void ProjectOrigin(btVector3 *a,btVector3 *b,btVector3 *prj,btScalar *sqd)

{
  btScalar bVar1;
  float fVar2;
  float fVar3;
  btVector3 d;
  btVector3 p;
  btVector3 local_48;
  btVector3 local_38;
  btVector3 local_28;
  
  local_48 = operator-(b,a);
  bVar1 = btVector3::length2(&local_48);
  if (1.1920929e-07 < bVar1) {
    fVar2 = -(a->m_floats[2] * local_48.m_floats[2] +
             a->m_floats[0] * local_48.m_floats[0] + local_48.m_floats[1] * a->m_floats[1]) / bVar1;
    fVar3 = 1.0;
    if (fVar2 <= 1.0) {
      fVar3 = fVar2;
    }
    fVar3 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar3);
    local_28.m_floats[1] = fVar3 * local_48.m_floats[1];
    local_28.m_floats[0] = fVar3 * local_48.m_floats[0];
    local_28.m_floats[2] = fVar3 * local_48.m_floats[2];
    local_28.m_floats[3] = 0.0;
    local_38 = operator+(a,&local_28);
    bVar1 = btVector3::length2(&local_38);
    if (bVar1 < *sqd) {
      *(undefined8 *)prj->m_floats = local_38.m_floats._0_8_;
      *(undefined8 *)(prj->m_floats + 2) = local_38.m_floats._8_8_;
      *sqd = bVar1;
    }
  }
  return;
}

Assistant:

static inline void			ProjectOrigin(	const btVector3& a,
										  const btVector3& b,
										  btVector3& prj,
										  btScalar& sqd)
{
	const btVector3	d=b-a;
	const btScalar	m2=d.length2();
	if(m2>SIMD_EPSILON)
	{	
		const btScalar	t=Clamp<btScalar>(-btDot(a,d)/m2,0,1);
		const btVector3	p=a+d*t;
		const btScalar	l2=p.length2();
		if(l2<sqd)
		{
			prj=p;
			sqd=l2;
		}
	}
}